

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

uint64_t __thiscall
capnp::compiler::Compiler::Impl::addNode(Impl *this,uint64_t desiredId,Node *node)

{
  Module *pMVar1;
  long lVar2;
  undefined8 *puVar3;
  char *pcVar4;
  char (*in_R8) [23];
  char (*params_2) [23];
  char (*pacVar5) [23];
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false,_false>,_bool>
  pVar6;
  String local_68;
  undefined1 local_50 [32];
  
  local_50._0_8_ = desiredId;
  local_50._8_8_ = node;
  pVar6 = std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>,std::allocator<std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_long,capnp::compiler::Compiler::Node*>>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>,std::allocator<std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->nodesById);
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    do {
      if ((long)desiredId < 0) {
        kj::hex((CappedArray<char,_17UL> *)local_50,desiredId);
        kj::str<char_const(&)[17],kj::CappedArray<char,17ul>,char_const(&)[2]>
                  (&local_68,(kj *)"Duplicate ID @0x",(char (*) [17])local_50,
                   (CappedArray<char,_17UL> *)0x1cc3cd,(char (*) [2])in_R8);
        pcVar4 = "";
        if ((char (*) [23])local_68.content.size_ != (char (*) [23])0x0) {
          pcVar4 = local_68.content.ptr;
        }
        params_2 = (char (*) [23])
                   ((char *)local_68.content.size_ +
                   ((char (*) [23])local_68.content.size_ == (char (*) [23])0x0));
        pMVar1 = node->module->parserModule;
        (**(pMVar1->super_ErrorReporter)._vptr_ErrorReporter)
                  (pMVar1,(ulong)node->startByte,(ulong)node->endByte,pcVar4);
        pacVar5 = (char (*) [23])local_68.content.size_;
        pcVar4 = local_68.content.ptr;
        if (local_68.content.ptr != (char *)0x0) {
          local_68.content.ptr = (char *)0x0;
          local_68.content.size_ = 0;
          (*(code *)**(undefined8 **)local_68.content.disposer)
                    (local_68.content.disposer,pcVar4,1,pacVar5,pacVar5,0);
          params_2 = pacVar5;
        }
        lVar2 = *(long *)((long)pVar6.first.
                                super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                                ._M_cur.
                                super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                         + 0x10);
        kj::hex((CappedArray<char,_17UL> *)local_50,desiredId);
        kj::str<char_const(&)[7],kj::CappedArray<char,17ul>,char_const(&)[23]>
                  (&local_68,(kj *)0x1caccd,(char (*) [7])local_50,
                   (CappedArray<char,_17UL> *)" originally used here.",params_2);
        pcVar4 = "";
        if ((char (*) [23])local_68.content.size_ != (char (*) [23])0x0) {
          pcVar4 = local_68.content.ptr;
        }
        in_R8 = (char (*) [23])
                ((char *)local_68.content.size_ +
                ((char (*) [23])local_68.content.size_ == (char (*) [23])0x0));
        puVar3 = *(undefined8 **)(*(long *)(lVar2 + 8) + 8);
        (**(code **)*puVar3)
                  (puVar3,*(undefined4 *)(lVar2 + 0x6c),*(undefined4 *)(lVar2 + 0x70),pcVar4);
        pacVar5 = (char (*) [23])local_68.content.size_;
        pcVar4 = local_68.content.ptr;
        if (local_68.content.ptr != (char *)0x0) {
          local_68.content.ptr = (char *)0x0;
          local_68.content.size_ = 0;
          (*(code *)**(undefined8 **)local_68.content.disposer)(local_68.content.disposer,pcVar4,1);
          in_R8 = pacVar5;
        }
      }
      desiredId = this->nextBogusId;
      this->nextBogusId = desiredId + 1;
      local_50._0_8_ = desiredId;
      local_50._8_8_ = node;
      pVar6 = std::
              _Hashtable<unsigned_long,std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>,std::allocator<std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_long,capnp::compiler::Compiler::Node*>>
                        ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>,std::allocator<std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&this->nodesById,(CappedArray<char,_17UL> *)local_50);
    } while (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
  }
  return desiredId;
}

Assistant:

uint64_t Compiler::Impl::addNode(uint64_t desiredId, Node& node) {
  for (;;) {
    auto insertResult = nodesById.insert(std::make_pair(desiredId, &node));
    if (insertResult.second) {
      return desiredId;
    }

    // Only report an error if this ID is not bogus.  Actual IDs specified in the original source
    // code are required to have the upper bit set.  Anything else must have been manufactured
    // at some point to cover up an error.
    if (desiredId & (1ull << 63)) {
      node.addError(kj::str("Duplicate ID @0x", kj::hex(desiredId), "."));
      insertResult.first->second->addError(
          kj::str("ID @0x", kj::hex(desiredId), " originally used here."));
    }

    // Assign a new bogus ID.
    desiredId = nextBogusId++;
  }
}